

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

AggregateFunction * duckdb::MinFunction::GetFunction(void)

{
  AggregateFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator local_72;
  allocator_type local_71;
  LogicalType local_70;
  LogicalType local_58;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  string local_28;
  
  ::std::__cxx11::string::string((string *)&local_28,"min",&local_72);
  LogicalType::LogicalType(&local_58,ANY);
  __l._M_len = 1;
  __l._M_array = &local_58;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_40,__l,&local_71);
  LogicalType::LogicalType(&local_70,ANY);
  AggregateFunction::AggregateFunction
            (in_RDI,&local_28,(vector<duckdb::LogicalType,_true> *)&local_40,&local_70,
             (aggregate_size_t)0x0,(aggregate_initialize_t)0x0,(aggregate_update_t)0x0,
             (aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,
             BindMinMax<duckdb::MinOperation,duckdb::MinOperationString,duckdb::MinOperationVector>,
             (aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,
             (aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  LogicalType::~LogicalType(&local_70);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_40);
  LogicalType::~LogicalType(&local_58);
  ::std::__cxx11::string::~string((string *)&local_28);
  return in_RDI;
}

Assistant:

AggregateFunction MinFunction::GetFunction() {
	return GetMinMaxOperator<MinOperation, MinOperationString, MinOperationVector>("min");
}